

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O1

int fe_process_frames_ext
              (fe_t *fe,int16 **inout_spch,size_t *inout_nsamps,mfcc_t **buf_cep,
              int32 *inout_nframes,int16 *voiced_spch,int32 *voiced_spch_nsamps,int32 *out_frameidx)

{
  size_t sVar1;
  int16 *in;
  int32 iVar2;
  int outidx;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int16 *piVar6;
  short sVar7;
  int iVar8;
  size_t __n;
  long lVar9;
  int local_64;
  
  if (buf_cep == (mfcc_t **)0x0) {
    uVar4 = (long)fe->num_overflow_samps + *inout_nsamps;
    iVar8 = 0;
    if ((ulong)(long)fe->frame_size <= uVar4) {
      iVar8 = (int)((uVar4 - (long)fe->frame_size) / (ulong)(long)fe->frame_shift) + 1;
    }
    *inout_nframes = iVar8;
    if (fe->vad_data->in_speech == '\0') {
      iVar2 = fe_prespch_ncep(fe->vad_data->prespch_buf);
      *inout_nframes = *inout_nframes + iVar2;
    }
    return *inout_nframes;
  }
  if (out_frameidx != (int32 *)0x0) {
    *out_frameidx = 0;
  }
  sVar1 = *inout_nsamps;
  if (sVar1 + (long)fe->num_overflow_samps < (ulong)(long)fe->frame_size) {
    if (sVar1 != 0) {
      memcpy(fe->overflow_samps + fe->num_overflow_samps,*inout_spch,sVar1 * 2);
      sVar1 = *inout_nsamps;
      fe->num_overflow_samps = fe->num_overflow_samps + (short)sVar1;
      fe->num_processed_samps = fe->num_processed_samps + sVar1;
      *inout_spch = *inout_spch + *inout_nsamps;
      *inout_nsamps = 0;
    }
LAB_0012ed2d:
    *inout_nframes = 0;
    return 0;
  }
  if (*inout_nframes < 1) goto LAB_0012ed2d;
  local_64 = 0;
  if (((fe->vad_data->in_speech != '\0') &&
      (iVar2 = fe_prespch_ncep(fe->vad_data->prespch_buf), 0 < iVar2)) &&
     (local_64 = fe_copy_from_prespch(fe,inout_nframes,buf_cep,0), *inout_nframes < 1)) {
    *inout_nframes = local_64;
    return 0;
  }
  in = *inout_spch;
  sVar1 = *inout_nsamps;
  lVar5 = (long)fe->num_overflow_samps;
  if (lVar5 < 1) {
    fe_read_frame(fe,in,(int)fe->frame_size);
    lVar9 = (long)fe->frame_size;
    __n = lVar9 * 2;
  }
  else {
    lVar9 = fe->frame_size - lVar5;
    __n = lVar9 * 2;
    memcpy((void *)((ulong)((uint)(ushort)fe->num_overflow_samps * 2) + (long)fe->overflow_samps),in
           ,__n);
    fe_read_frame(fe,fe->overflow_samps,(int)fe->frame_size);
  }
  *inout_spch = (int16 *)(__n + (long)*inout_spch);
  *inout_nsamps = *inout_nsamps - lVar9;
  fe_write_frame(fe,buf_cep[local_64],(uint)(voiced_spch != (int16 *)0x0));
  iVar3 = (int)sVar1;
  outidx = fe_check_prespeech(fe,inout_nframes,buf_cep,local_64,out_frameidx,inout_nsamps,iVar3);
  iVar8 = *inout_nframes;
  while ((0 < iVar8 && ((ulong)(long)fe->frame_shift <= *inout_nsamps))) {
    fe_shift_frame(fe,*inout_spch,(int)fe->frame_shift);
    fe_write_frame(fe,buf_cep[outidx],(uint)(voiced_spch != (int16 *)0x0));
    outidx = fe_check_prespeech(fe,inout_nframes,buf_cep,outidx,out_frameidx,inout_nsamps,iVar3);
    sVar7 = fe->frame_shift;
    *inout_spch = *inout_spch + sVar7;
    *inout_nsamps = *inout_nsamps - (long)sVar7;
    iVar8 = *inout_nframes;
  }
  sVar7 = fe->num_overflow_samps;
  if ((long)sVar7 < 1) {
    iVar3 = (int)fe->frame_shift;
    iVar8 = (int)*inout_nsamps;
    if (iVar3 <= (int)*inout_nsamps) {
      iVar8 = iVar3;
    }
    sVar7 = fe->frame_size - fe->frame_shift;
    fe->num_overflow_samps = sVar7;
    piVar6 = *inout_spch;
    lVar5 = (long)piVar6 - (long)in >> 1;
    if (lVar5 < sVar7) {
      fe->num_overflow_samps = (int16)lVar5;
    }
    sVar7 = fe->num_overflow_samps + (short)iVar8;
    fe->num_overflow_samps = sVar7;
    if (sVar7 < 1) goto LAB_0012ef46;
    memcpy(fe->overflow_samps,piVar6 + ((long)iVar3 - (long)fe->frame_size),
           (ulong)(ushort)(sVar7 * 2));
    piVar6 = *inout_spch;
  }
  else {
    memmove(fe->overflow_samps,fe->overflow_samps + (lVar5 - sVar7),(ulong)(sVar7 * 2 & 0xffff));
    iVar3 = (int)((ulong)((long)*inout_spch - (long)in) >> 1) + (int)*inout_nsamps;
    iVar8 = (int)fe->frame_size - (int)fe->num_overflow_samps;
    if (iVar3 <= iVar8) {
      iVar8 = iVar3;
    }
    memcpy(fe->overflow_samps + fe->num_overflow_samps,in,(long)iVar8 * 2);
    fe->num_overflow_samps = fe->num_overflow_samps + (short)iVar8;
    piVar6 = *inout_spch;
    lVar5 = (long)piVar6 - (long)in >> 1;
    if (iVar8 <= lVar5) goto LAB_0012ef46;
    iVar8 = iVar8 - (int)lVar5;
  }
  *inout_spch = piVar6 + iVar8;
  *inout_nsamps = *inout_nsamps - (long)iVar8;
LAB_0012ef46:
  *inout_nframes = outidx;
  fe->num_processed_samps = fe->num_processed_samps + (sVar1 - *inout_nsamps);
  return 0;
}

Assistant:

int 
fe_process_frames_ext(fe_t *fe,
                  int16 const **inout_spch,
                  size_t *inout_nsamps,
                  mfcc_t **buf_cep,
                  int32 *inout_nframes,
                  int16 *voiced_spch,
                  int32 *voiced_spch_nsamps,
                  int32 *out_frameidx)
{
    int outidx, n_overflow, orig_n_overflow;
    int16 const *orig_spch;
    size_t orig_nsamps;
    
    /* The logic here is pretty complex, please be careful with modifications */

    /* FIXME: Dump PCM data if needed */

    /* In the special case where there is no output buffer, return the
     * maximum number of frames which would be generated. */
    if (buf_cep == NULL) {
        if (*inout_nsamps + fe->num_overflow_samps < (size_t)fe->frame_size)
            *inout_nframes = 0;
        else 
            *inout_nframes = 1
                + ((*inout_nsamps + fe->num_overflow_samps - fe->frame_size)
                   / fe->frame_shift);
        if (!fe->vad_data->in_speech)
            *inout_nframes += fe_prespch_ncep(fe->vad_data->prespch_buf);
        return *inout_nframes;
    }

    if (out_frameidx)
        *out_frameidx = 0;

    /* Are there not enough samples to make at least 1 frame? */
    if (*inout_nsamps + fe->num_overflow_samps < (size_t)fe->frame_size) {
        if (*inout_nsamps > 0) {
            /* Append them to the overflow buffer. */
            memcpy(fe->overflow_samps + fe->num_overflow_samps,
                   *inout_spch, *inout_nsamps * (sizeof(int16)));
            fe->num_overflow_samps += *inout_nsamps;
	    fe->num_processed_samps += *inout_nsamps;
            *inout_spch += *inout_nsamps;
            *inout_nsamps = 0;
        }
        /* We produced no frames of output, sorry! */
        *inout_nframes = 0;
        return 0;
    }

    /* Can't write a frame?  Then do nothing! */
    if (*inout_nframes < 1) {
        *inout_nframes = 0;
        return 0;
    }

    /* Index of output frame. */
    outidx = 0;

    /* Try to read from prespeech buffer */
    if (fe->vad_data->in_speech && fe_prespch_ncep(fe->vad_data->prespch_buf) > 0) {
    	outidx = fe_copy_from_prespch(fe, inout_nframes, buf_cep, outidx);
        if ((*inout_nframes) < 1) {
            /* mfcc buffer is filled from prespeech buffer */
            *inout_nframes = outidx;
            return 0;
        }
    }

    /* Keep track of the original start of the buffer. */
    orig_spch = *inout_spch;
    orig_nsamps = *inout_nsamps;
    orig_n_overflow = fe->num_overflow_samps;

    /* Start processing, taking care of any incoming overflow. */
    if (fe->num_overflow_samps > 0) {
        int offset = fe->frame_size - fe->num_overflow_samps;
        /* Append start of spch to overflow samples to make a full frame. */
        memcpy(fe->overflow_samps + fe->num_overflow_samps,
               *inout_spch, offset * sizeof(**inout_spch));
        fe_read_frame(fe, fe->overflow_samps, fe->frame_size);
        /* Update input-output pointers and counters. */
        *inout_spch += offset;
        *inout_nsamps -= offset;
    } else {
        fe_read_frame(fe, *inout_spch, fe->frame_size);
        /* Update input-output pointers and counters. */
        *inout_spch += fe->frame_size;
        *inout_nsamps -= fe->frame_size;
    }

    fe_write_frame(fe, buf_cep[outidx], voiced_spch != NULL);
    outidx = fe_check_prespeech(fe, inout_nframes, buf_cep, outidx, out_frameidx, inout_nsamps, orig_nsamps);

    /* Process all remaining frames. */
    while (*inout_nframes > 0 && *inout_nsamps >= (size_t)fe->frame_shift) {
        fe_shift_frame(fe, *inout_spch, fe->frame_shift);
        fe_write_frame(fe, buf_cep[outidx], voiced_spch != NULL);

	outidx = fe_check_prespeech(fe, inout_nframes, buf_cep, outidx, out_frameidx, inout_nsamps, orig_nsamps);

        /* Update input-output pointers and counters. */
        *inout_spch += fe->frame_shift;
        *inout_nsamps -= fe->frame_shift;
    }

    /* How many relevant overflow samples are there left? */
    if (fe->num_overflow_samps <= 0) {
        /* Maximum number of overflow samples past *inout_spch to save. */
        n_overflow = *inout_nsamps;
        if (n_overflow > fe->frame_shift)
            n_overflow = fe->frame_shift;
        fe->num_overflow_samps = fe->frame_size - fe->frame_shift;
        /* Make sure this isn't an illegal read! */
        if (fe->num_overflow_samps > *inout_spch - orig_spch)
            fe->num_overflow_samps = *inout_spch - orig_spch;
        fe->num_overflow_samps += n_overflow;
        if (fe->num_overflow_samps > 0) {
            memcpy(fe->overflow_samps,
                   *inout_spch - (fe->frame_size - fe->frame_shift),
                   fe->num_overflow_samps * sizeof(**inout_spch));
            /* Update the input pointer to cover this stuff. */
            *inout_spch += n_overflow;
            *inout_nsamps -= n_overflow;
        }
    } else {
        /* There is still some relevant data left in the overflow buffer. */
        /* Shift existing data to the beginning. */
        memmove(fe->overflow_samps,
                fe->overflow_samps + orig_n_overflow - fe->num_overflow_samps,
                fe->num_overflow_samps * sizeof(*fe->overflow_samps));
        /* Copy in whatever we had in the original speech buffer. */
        n_overflow = *inout_spch - orig_spch + *inout_nsamps;
        if (n_overflow > fe->frame_size - fe->num_overflow_samps)
            n_overflow = fe->frame_size - fe->num_overflow_samps;
        memcpy(fe->overflow_samps + fe->num_overflow_samps,
               orig_spch, n_overflow * sizeof(*orig_spch));
        fe->num_overflow_samps += n_overflow;
        /* Advance the input pointers. */
        if (n_overflow > *inout_spch - orig_spch) {
            n_overflow -= (*inout_spch - orig_spch);
            *inout_spch += n_overflow;
            *inout_nsamps -= n_overflow;
        }
    }

    /* Finally update the frame counter with the number of frames
     * and global sample counter with number of samples we procesed */
    *inout_nframes = outidx; /* FIXME: Not sure why I wrote it this way... */
    fe->num_processed_samps += orig_nsamps - *inout_nsamps;

    return 0;
}